

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,Point2f u)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  Float FVar30;
  undefined1 in_register_00001208 [56];
  undefined1 auVar31 [64];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 local_78 [16];
  undefined4 local_68;
  Tuple3<pbrt::Point3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  Point3fi local_30;
  
  auVar31._8_56_ = in_register_00001208;
  auVar31._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar28 = vmovshdup_avx(auVar31._0_16_);
  fVar32 = auVar28._0_4_;
  fVar29 = u.super_Tuple2<pbrt::Point2,_float>.x;
  lVar8 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar15 = (long)this->triIndex;
  lVar9 = *(long *)(lVar8 + 8);
  lVar10 = *(long *)(lVar8 + 0x10);
  lVar16 = (long)*(int *)(lVar9 + lVar15 * 0xc);
  lVar17 = (long)*(int *)(lVar9 + 4 + lVar15 * 0xc);
  lVar15 = (long)*(int *)(lVar9 + 8 + lVar15 * 0xc);
  bVar13 = fVar29 < fVar32;
  fVar18 = (float)((uint)bVar13 * (int)(fVar32 - fVar29 * 0.5) + (uint)!bVar13 * (int)(fVar32 * 0.5)
                  );
  fVar19 = (float)((uint)bVar13 * (int)(fVar29 * 0.5) + (uint)!bVar13 * (int)(fVar29 - fVar32 * 0.5)
                  );
  auVar28._4_4_ = fVar19;
  auVar28._0_4_ = fVar19;
  auVar28._8_4_ = fVar19;
  auVar28._12_4_ = fVar19;
  auVar27._4_4_ = fVar18;
  auVar27._0_4_ = fVar18;
  auVar27._8_4_ = fVar18;
  auVar27._12_4_ = fVar18;
  fVar29 = *(float *)(lVar10 + 8 + lVar16 * 0xc);
  auVar22._4_4_ = fVar29;
  auVar22._0_4_ = fVar29;
  auVar22._8_4_ = fVar29;
  auVar22._12_4_ = fVar29;
  uVar2 = *(ulong *)(lVar10 + lVar16 * 0xc);
  uVar3 = *(ulong *)(lVar10 + lVar17 * 0xc);
  fVar32 = *(float *)(lVar10 + 8 + lVar17 * 0xc);
  fVar1 = *(float *)(lVar10 + 8 + lVar15 * 0xc);
  uVar4 = *(ulong *)(lVar10 + lVar15 * 0xc);
  fVar12 = (1.0 - fVar19) - fVar18;
  fVar11 = fVar32 * fVar18;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar2;
  auVar20 = vmulps_avx512vl(auVar28,auVar40);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar3;
  auVar21 = vmulps_avx512vl(auVar27,auVar42);
  auVar28 = vinsertps_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar1),0x10);
  auVar25._4_4_ = fVar12;
  auVar25._0_4_ = fVar12;
  auVar25._8_4_ = fVar12;
  auVar25._12_4_ = fVar12;
  fVar1 = fVar12 * fVar1;
  auVar27 = vsubps_avx(auVar28,auVar22);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar4;
  auVar22 = vmulps_avx512vl(auVar25,auVar44);
  auVar23 = vaddps_avx512vl(auVar20,auVar21);
  auVar28 = vshufps_avx(auVar27,auVar27,0xe1);
  auVar23 = vaddps_avx512vl(auVar23,auVar22);
  local_50.z = fVar29 * fVar19 + fVar11 + fVar1;
  local_50._0_8_ = vmovlps_avx512f(auVar23);
  auVar23 = vinsertps_avx512f(auVar44,auVar42,0x50);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar3;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar4;
  auVar25 = vinsertps_avx512f(auVar43,auVar45,0x50);
  auVar24 = vsubps_avx512vl(auVar23,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar2;
  auVar25 = vsubps_avx512vl(auVar25,auVar41);
  lVar9 = *(long *)(lVar8 + 0x18);
  auVar26 = vmulps_avx512vl(auVar25,auVar28);
  auVar28 = vinsertps_avx512f(auVar25,auVar27,0x1c);
  auVar23 = vfmsub213ps_fma(auVar24,auVar27,auVar26);
  auVar27 = vinsertps_avx512f(auVar25,auVar27,0x4c);
  auVar27 = vfnmadd213ps_avx512vl(auVar27,auVar28,auVar26);
  auVar28 = vmovshdup_avx(auVar24);
  auVar26 = vmovshdup_avx512vl(auVar25);
  auVar38._0_4_ = auVar23._0_4_ + auVar27._0_4_;
  auVar38._4_4_ = auVar23._4_4_ + auVar27._4_4_;
  auVar38._8_4_ = auVar23._8_4_ + auVar27._8_4_;
  auVar38._12_4_ = auVar23._12_4_ + auVar27._12_4_;
  auVar27 = ZEXT416((uint)(auVar28._0_4_ * auVar24._0_4_));
  auVar23 = vfmsub213ss_avx512f(auVar26,auVar25,auVar27);
  auVar27 = vfnmadd213ss_fma(auVar24,auVar28,auVar27);
  auVar24._0_4_ = auVar38._0_4_ * auVar38._0_4_;
  auVar24._4_4_ = auVar38._4_4_ * auVar38._4_4_;
  auVar24._8_4_ = auVar38._8_4_ * auVar38._8_4_;
  auVar24._12_4_ = auVar38._12_4_ * auVar38._12_4_;
  auVar28 = vhaddps_avx(auVar24,auVar24);
  auVar27 = vaddss_avx512f(auVar23,auVar27);
  fVar32 = auVar27._0_4_;
  auVar28 = ZEXT416((uint)(fVar32 * fVar32 + auVar28._0_4_));
  auVar28 = vsqrtss_avx(auVar28,auVar28);
  fVar39 = auVar28._0_4_;
  auVar26._4_4_ = fVar39;
  auVar26._0_4_ = fVar39;
  auVar26._8_4_ = fVar39;
  auVar26._12_4_ = fVar39;
  auVar23._0_4_ = fVar32 / fVar39;
  auVar23._4_12_ = auVar27._4_12_;
  auVar28 = vdivps_avx(auVar38,auVar26);
  local_78 = vshufps_avx(auVar28,auVar28,0xe1);
  if (lVar9 == 0) {
    if (*(char *)(lVar8 + 0x38) != *(char *)(lVar8 + 0x39)) {
      auVar28 = vshufps_avx(auVar28,auVar28,0xe1);
      local_78._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      local_78._8_4_ = auVar28._8_4_ ^ 0x80000000;
      local_78._12_4_ = auVar28._12_4_ ^ 0x80000000;
      auVar23._0_8_ = (ulong)(uint)auVar23._0_4_ ^ 0x8000000080000000;
      auVar23._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar23._12_4_ = auVar27._12_4_ ^ 0x80000000;
    }
  }
  else {
    uVar5 = *(undefined8 *)(lVar9 + 4 + lVar16 * 0xc);
    uVar6 = *(undefined8 *)(lVar9 + 4 + lVar17 * 0xc);
    auVar25 = vinsertps_avx(auVar28,auVar23,0x10);
    uVar7 = *(undefined8 *)(lVar9 + 4 + lVar15 * 0xc);
    auVar35._0_4_ = fVar19 * (float)uVar5 + fVar18 * (float)uVar6 + fVar12 * (float)uVar7;
    auVar35._4_4_ =
         fVar19 * (float)((ulong)uVar5 >> 0x20) + fVar18 * (float)((ulong)uVar6 >> 0x20) +
         fVar12 * (float)((ulong)uVar7 >> 0x20);
    auVar35._8_4_ = fVar19 * 0.0 + fVar18 * 0.0 + fVar12 * 0.0;
    auVar35._12_4_ = fVar19 * 0.0 + fVar18 * 0.0 + fVar12 * 0.0;
    auVar24 = vmovshdup_avx(auVar35);
    fVar32 = auVar23._0_4_ * auVar24._0_4_;
    auVar37._0_4_ = -fVar32;
    auVar37._4_4_ = 0x80000000;
    auVar37._8_4_ = 0x80000000;
    auVar37._12_4_ = 0x80000000;
    auVar24 = vinsertps_avx(ZEXT416((uint)fVar32),auVar37,0x10);
    auVar25 = vfmadd231ps_fma(auVar24,auVar35,auVar25);
    auVar24 = vmovshdup_avx(auVar28);
    auVar25 = vhaddps_avx(auVar25,auVar25);
    auVar25 = vfmadd213ss_fma(auVar24,ZEXT416((uint)(fVar19 * *(float *)(lVar9 + lVar16 * 0xc) +
                                                     fVar18 * *(float *)(lVar9 + lVar17 * 0xc) +
                                                    fVar12 * *(float *)(lVar9 + lVar15 * 0xc))),
                              auVar25);
    auVar36._0_12_ = ZEXT812(0);
    auVar36._12_4_ = 0;
    if (auVar25._0_4_ < 0.0) {
      auVar28 = vshufps_avx(auVar28,auVar28,0xe1);
      local_78._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      local_78._8_4_ = auVar28._8_4_ ^ 0x80000000;
      local_78._12_4_ = auVar28._12_4_ ^ 0x80000000;
    }
    uVar5 = vcmpss_avx512f(auVar25,auVar36,1);
    bVar13 = (bool)((byte)uVar5 & 1);
    auVar23._0_4_ = (float)((uint)bVar13 * (int)-auVar23._0_4_ + (uint)!bVar13 * (int)auVar23._0_4_)
    ;
  }
  auVar34._8_4_ = 0x7fffffff;
  auVar34._0_8_ = 0x7fffffff7fffffff;
  auVar34._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx(auVar20,auVar34);
  auVar27 = vandps_avx(auVar21,auVar34);
  auVar25 = vandps_avx(ZEXT416((uint)(fVar29 * fVar19)),auVar34);
  auVar20 = vandps_avx(ZEXT416((uint)fVar11),auVar34);
  auVar21 = vandps_avx(ZEXT416((uint)fVar1),auVar34);
  auVar22 = vandps_avx(auVar22,auVar34);
  auVar33._0_4_ = auVar28._0_4_ + auVar27._0_4_ + auVar22._0_4_;
  auVar33._4_4_ = auVar28._4_4_ + auVar27._4_4_ + auVar22._4_4_;
  auVar33._8_4_ = auVar28._8_4_ + auVar27._8_4_ + auVar22._8_4_;
  auVar33._12_4_ = auVar28._12_4_ + auVar27._12_4_ + auVar22._12_4_;
  auVar14._8_4_ = 0x34c00005;
  auVar14._0_8_ = 0x34c0000534c00005;
  auVar14._12_4_ = 0x34c00005;
  auVar28 = vmulps_avx512vl(auVar33,auVar14);
  local_40.z = (auVar25._0_4_ + auVar20._0_4_ + auVar21._0_4_) * 3.57628e-07;
  local_40._0_8_ = vmovlps_avx(auVar28);
  Point3fi::Point3fi(&local_30,(Point3f *)&local_50,(Vector3f *)&local_40);
  *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_30.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)
       local_30.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) =
       local_30.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  FVar30 = Area(this);
  __return_storage_ptr__->set = true;
  auVar20._0_12_ = ZEXT812(0);
  auVar20._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar20;
  uVar5 = vmovlps_avx(local_78);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar5;
  local_68 = auVar23._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_68;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar20;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 1.0 / FVar30;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Sample point on triangle uniformly by area
        pstd::array<Float, 3> b = SampleUniformTriangle(u);
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;

        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        return ShapeSample{Interaction(Point3fi(p, pError), n), 1 / Area()};
    }